

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_rsassa_pkcs1_v15_verify
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  byte bVar1;
  int iVar2;
  uchar *end_00;
  int local_494;
  undefined1 local_490 [8];
  mbedtls_asn1_buf oid;
  mbedtls_md_info_t *md_info;
  uchar local_468;
  char local_467;
  uchar local_466 [2];
  mbedtls_md_type_t msg_md_alg;
  uchar buf [1024];
  uchar *end;
  uchar *p;
  size_t asn1_len;
  size_t siglen;
  size_t len;
  int ret;
  uint hashlen_local;
  mbedtls_md_type_t md_alg_local;
  int mode_local;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_rsa_context *ctx_local;
  
  if ((mode == 1) && (ctx->padding != 0)) {
    ctx_local._4_4_ = -0x4080;
  }
  else {
    asn1_len = ctx->len;
    if ((asn1_len < 0x10) || (0x400 < asn1_len)) {
      ctx_local._4_4_ = -0x4080;
    }
    else {
      len._4_4_ = hashlen;
      ret = md_alg;
      hashlen_local = mode;
      _md_alg_local = p_rng;
      p_rng_local = f_rng;
      f_rng_local = (_func_int_void_ptr_uchar_ptr_size_t *)ctx;
      if (mode == 0) {
        local_494 = mbedtls_rsa_public(ctx,sig,&local_468);
      }
      else {
        local_494 = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,&local_468);
      }
      len._0_4_ = local_494;
      if (local_494 == 0) {
        if ((local_468 == '\0') && (end = local_466, local_467 == '\x01')) {
          for (; *end != '\0'; end = end + 1) {
            if (((uchar *)((long)&md_info + asn1_len + 7) <= end) || (*end != 0xff)) {
              return -0x4100;
            }
          }
          end = end + 1;
          siglen = asn1_len - ((long)end - (long)&local_468);
          if ((siglen == len._4_4_) && (ret == 0)) {
            iVar2 = memcmp(end,hash,(ulong)len._4_4_);
            if (iVar2 == 0) {
              ctx_local._4_4_ = 0;
            }
            else {
              ctx_local._4_4_ = -0x4380;
            }
          }
          else {
            oid.p = (uchar *)mbedtls_md_info_from_type(ret);
            if ((mbedtls_md_info_t *)oid.p == (mbedtls_md_info_t *)0x0) {
              ctx_local._4_4_ = -0x4080;
            }
            else {
              bVar1 = mbedtls_md_get_size((mbedtls_md_info_t *)oid.p);
              len._4_4_ = (uint)bVar1;
              end_00 = end + siglen;
              len._0_4_ = mbedtls_asn1_get_tag(&end,end_00,(size_t *)&p,0x30);
              if ((int)len == 0) {
                if (p + 2 == (uchar *)siglen) {
                  len._0_4_ = mbedtls_asn1_get_tag(&end,end_00,(size_t *)&p,0x30);
                  if ((int)len == 0) {
                    if (p + (ulong)len._4_4_ + 6 == (uchar *)siglen) {
                      len._0_4_ = mbedtls_asn1_get_tag(&end,end_00,(size_t *)&oid,6);
                      if ((int)len == 0) {
                        oid.len = (size_t)end;
                        end = end + oid._0_8_;
                        iVar2 = mbedtls_oid_get_md_alg
                                          ((mbedtls_asn1_buf *)local_490,
                                           (mbedtls_md_type_t *)((long)&md_info + 4));
                        if (iVar2 == 0) {
                          if (ret == md_info._4_4_) {
                            len._0_4_ = mbedtls_asn1_get_tag(&end,end_00,(size_t *)&p,5);
                            if ((int)len == 0) {
                              len._0_4_ = mbedtls_asn1_get_tag(&end,end_00,(size_t *)&p,4);
                              if ((int)len == 0) {
                                if (p == (uchar *)(ulong)len._4_4_) {
                                  iVar2 = memcmp(end,hash,(ulong)len._4_4_);
                                  if (iVar2 == 0) {
                                    if (end + len._4_4_ == end_00) {
                                      ctx_local._4_4_ = 0;
                                    }
                                    else {
                                      ctx_local._4_4_ = -0x4380;
                                    }
                                  }
                                  else {
                                    ctx_local._4_4_ = -0x4380;
                                  }
                                }
                                else {
                                  ctx_local._4_4_ = -0x4380;
                                }
                              }
                              else {
                                ctx_local._4_4_ = -0x4380;
                              }
                            }
                            else {
                              ctx_local._4_4_ = -0x4380;
                            }
                          }
                          else {
                            ctx_local._4_4_ = -0x4380;
                          }
                        }
                        else {
                          ctx_local._4_4_ = -0x4380;
                        }
                      }
                      else {
                        ctx_local._4_4_ = -0x4380;
                      }
                    }
                    else {
                      ctx_local._4_4_ = -0x4380;
                    }
                  }
                  else {
                    ctx_local._4_4_ = -0x4380;
                  }
                }
                else {
                  ctx_local._4_4_ = -0x4380;
                }
              }
              else {
                ctx_local._4_4_ = -0x4380;
              }
            }
          }
        }
        else {
          ctx_local._4_4_ = -0x4100;
        }
      }
      else {
        ctx_local._4_4_ = local_494;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_rsassa_pkcs1_v15_verify( mbedtls_rsa_context *ctx,
                                 int (*f_rng)(void *, unsigned char *, size_t),
                                 void *p_rng,
                                 int mode,
                                 mbedtls_md_type_t md_alg,
                                 unsigned int hashlen,
                                 const unsigned char *hash,
                                 const unsigned char *sig )
{
    int ret;
    size_t len, siglen, asn1_len;
    unsigned char *p, *end;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];
    mbedtls_md_type_t msg_md_alg;
    const mbedtls_md_info_t *md_info;
    mbedtls_asn1_buf oid;

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V15 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    siglen = ctx->len;

    if( siglen < 16 || siglen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, sig, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, sig, buf );

    if( ret != 0 )
        return( ret );

    p = buf;

    if( *p++ != 0 || *p++ != MBEDTLS_RSA_SIGN )
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );

    while( *p != 0 )
    {
        if( p >= buf + siglen - 1 || *p != 0xFF )
            return( MBEDTLS_ERR_RSA_INVALID_PADDING );
        p++;
    }
    p++;

    len = siglen - ( p - buf );

    if( len == hashlen && md_alg == MBEDTLS_MD_NONE )
    {
        if( memcmp( p, hash, hashlen ) == 0 )
            return( 0 );
        else
            return( MBEDTLS_ERR_RSA_VERIFY_FAILED );
    }

    md_info = mbedtls_md_info_from_type( md_alg );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    hashlen = mbedtls_md_get_size( md_info );

    end = p + len;

    // Parse the ASN.1 structure inside the PKCS#1 v1.5 structure
    //
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &asn1_len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( asn1_len + 2 != len )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &asn1_len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( asn1_len + 6 + hashlen != len )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &oid.len, MBEDTLS_ASN1_OID ) ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    oid.p = p;
    p += oid.len;

    if( mbedtls_oid_get_md_alg( &oid, &msg_md_alg ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( md_alg != msg_md_alg )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    /*
     * assume the algorithm parameters must be NULL
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &asn1_len, MBEDTLS_ASN1_NULL ) ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &asn1_len, MBEDTLS_ASN1_OCTET_STRING ) ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( asn1_len != hashlen )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    if( memcmp( p, hash, hashlen ) != 0 )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    p += hashlen;

    if( p != end )
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );

    return( 0 );
}